

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportTestStartCapturesTestNameAndSuiteHelper>
               (DeferredTestReporterFixtureReportTestStartCapturesTestNameAndSuiteHelper *testObject
               ,TestDetails *details)

{
  TestResults *pTVar1;
  int iVar2;
  TestDetails **ppTVar3;
  DeferredTestResultList *this;
  reference actual;
  TestResults **ppTVar4;
  undefined8 *puVar5;
  pointer local_4b8;
  TestDetails local_4b0;
  SignalTranslator sig;
  
  ppTVar3 = CurrentTest::Details();
  *ppTVar3 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar2 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar2 == 0) {
    DeferredTestReporter::ReportTestStart
              ((DeferredTestReporter *)testObject,
               &(testObject->super_DeferredTestReporterFixture).details);
    this = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    actual = std::
             vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::at
                       (this,0);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_4b8 = (testObject->super_DeferredTestReporterFixture).testName._M_dataplus._M_p;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar3,0x39);
    CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&local_4b8,&actual->testName,&local_4b0);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_4b8 = (testObject->super_DeferredTestReporterFixture).testSuite._M_dataplus._M_p;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar3,0x3a);
    CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&local_4b8,&actual->suiteName,&local_4b0);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Unhandled system exception";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}